

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetBXToolInfo(ndicapi *pol,int portHandle,char *outToolInfo)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    while (pol->BxHandles[uVar2] != portHandle) {
      uVar2 = uVar2 + 1;
      if ((uint)bVar1 == uVar2) {
        return 1;
      }
    }
  }
  if ((uint)uVar2 == (uint)bVar1) {
    return 1;
  }
  *outToolInfo = pol->BxToolMarkerInformation[uVar2 & 0xffffffff][0];
  return 0;
}

Assistant:

ndicapiExport int ndiGetBXToolInfo(ndicapi* pol, int portHandle, char& outToolInfo)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  outToolInfo = pol->BxToolMarkerInformation[i][0];
  return NDI_OKAY;
}